

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O2

hugeint_t __thiscall
duckdb::CastInterpolation::Cast<duckdb::hugeint_t,duckdb::hugeint_t>
          (CastInterpolation *this,hugeint_t *src,Vector *result)

{
  hugeint_t hVar1;
  
  hVar1.upper = (int64_t)result;
  hVar1.lower = *(uint64_t *)(this + 8);
  hVar1 = Cast::Operation<duckdb::hugeint_t,duckdb::hugeint_t>(*(Cast **)this,hVar1);
  return hVar1;
}

Assistant:

static inline TARGET_TYPE Cast(const INPUT_TYPE &src, Vector &result) {
		return Cast::Operation<INPUT_TYPE, TARGET_TYPE>(src);
	}